

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score_test.cc
# Opt level: O3

void __thiscall
xLearn::LinearScoreTest_calc_score_overflow_Test::~LinearScoreTest_calc_score_overflow_Test
          (LinearScoreTest_calc_score_overflow_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LinearScoreTest, calc_score_overflow) {
  SparseRow row(2*kLength);
  Model model;
  model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                0, 0, 2);
  real_t* w = model.GetParameter_w();
  index_t num_w = model.GetNumParameter_w();
  for (index_t i = 0; i < num_w; ++i) {
    w[i] = 3.0;
  }
  model.GetParameter_b()[0] = 0.0;
  // Init SparseRow
  for (index_t i = 0; i < 2*kLength; ++i) {
    row[i].feat_id = i;
    row[i].feat_val = 2.0;
  }
  LinearScore score;
  real_t val = score.CalcScore(&row, model);
  EXPECT_FLOAT_EQ(val, 600.0);
}